

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

void __thiscall
QStandardItemModelPrivate::columnsRemoved
          (QStandardItemModelPrivate *this,QStandardItem *parent,int column,int count)

{
  QStandardItem *pQVar1;
  const_reference ppQVar2;
  int in_ECX;
  int in_EDX;
  QStandardItem *in_RSI;
  QStandardItemModelPrivate *in_RDI;
  QStandardItem *oldItem;
  int i;
  QStandardItemModel *q;
  QStandardItem *in_stack_ffffffffffffffb8;
  int local_24;
  QStandardItem *mod;
  QStandardItemModelPrivate *this_00;
  
  this_00 = in_RDI;
  q_func(in_RDI);
  mod = in_RSI;
  pQVar1 = QScopedPointer<QStandardItem,_QScopedPointerDeleter<QStandardItem>_>::data(&in_RDI->root)
  ;
  local_24 = in_EDX;
  if (in_RSI == pQVar1) {
    for (; local_24 < in_EDX + in_ECX; local_24 = local_24 + 1) {
      ppQVar2 = QList<QStandardItem_*>::at
                          ((QList<QStandardItem_*> *)in_RDI,(qsizetype)in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffb8 = *ppQVar2;
      if (in_stack_ffffffffffffffb8 != (QStandardItem *)0x0) {
        QStandardItem::d_func((QStandardItem *)0x8cfca2);
        QStandardItemPrivate::setModel((QStandardItemPrivate *)this_00,(QStandardItemModel *)mod);
        (*in_stack_ffffffffffffffb8->_vptr_QStandardItem[1])();
      }
    }
    QList<QStandardItem_*>::remove(&in_RDI->columnHeaderItems,(char *)(long)in_EDX);
  }
  QAbstractItemModel::endRemoveColumns();
  return;
}

Assistant:

void QStandardItemModelPrivate::columnsRemoved(QStandardItem *parent,
                                               int column, int count)
{
    Q_Q(QStandardItemModel);
    if (parent == root.data()) {
        for (int i = column; i < column + count; ++i) {
            QStandardItem *oldItem = columnHeaderItems.at(i);
            if (oldItem)
                oldItem->d_func()->setModel(nullptr);
            delete oldItem;
        }
        columnHeaderItems.remove(column, count);
    }
    q->endRemoveColumns();
}